

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall Assimp::OpenGEX::OpenGEXImporter::copyLights(OpenGEXImporter *this,aiScene *pScene)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  aiLight **ppaVar5;
  iterator __first;
  iterator __last;
  aiScene *pScene_local;
  OpenGEXImporter *this_local;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x499,"void Assimp::OpenGEX::OpenGEXImporter::copyLights(aiScene *)");
  }
  bVar2 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::empty(&this->m_lightCache);
  if (!bVar2) {
    sVar3 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->m_lightCache);
    pScene->mNumLights = (uint)sVar3;
    auVar1 = ZEXT416(pScene->mNumLights) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiLight **)operator_new__(uVar4);
    pScene->mLights = ppaVar5;
    __first = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::begin(&this->m_lightCache);
    __last = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::end(&this->m_lightCache);
    std::
    copy<__gnu_cxx::__normal_iterator<aiLight**,std::vector<aiLight*,std::allocator<aiLight*>>>,aiLight**>
              ((__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiLight_**,_std::vector<aiLight_*,_std::allocator<aiLight_*>_>_>)
               __last._M_current,pScene->mLights);
  }
  return;
}

Assistant:

void OpenGEXImporter::copyLights( aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( m_lightCache.empty() ) {
        return;
    }

    pScene->mNumLights = static_cast<unsigned int>(m_lightCache.size());
    pScene->mLights = new aiLight*[ pScene->mNumLights ];
    std::copy( m_lightCache.begin(), m_lightCache.end(), pScene->mLights );
}